

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOBLoader.cpp
# Opt level: O1

void __thiscall Assimp::LWOImporter::LoadLWOBSurface(LWOImporter *this,uint size)

{
  uint8_t *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  byte bVar3;
  vector<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_> *this_00;
  uint8_t *puVar4;
  pointer pSVar5;
  ushort uVar6;
  byte *pbVar7;
  long lVar8;
  byte *pbVar9;
  Logger *pLVar10;
  uint *puVar11;
  Texture *this_01;
  runtime_error *prVar12;
  Axes AVar13;
  uint uVar14;
  int iVar15;
  ulong uVar16;
  TextureList *list;
  char *message;
  ulong uVar17;
  uint uVar18;
  uint *puVar19;
  Surface local_178;
  
  pbVar7 = this->mFileBuffer + size;
  this_00 = this->mSurfaces;
  LWO::Surface::Surface(&local_178);
  std::vector<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_>::
  emplace_back<Assimp::LWO::Surface>(this_00,&local_178);
  LWO::Surface::~Surface(&local_178);
  puVar4 = this->mFileBuffer;
  pSVar5 = (this->mSurfaces->
           super__Vector_base<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (*puVar4 != '\0') {
    lVar8 = 1;
    do {
      if (size < (uint)lVar8) {
        pLVar10 = DefaultLogger::get();
        Logger::warn(pLVar10,"LWO: Invalid file, string is is too long");
        break;
      }
      this->mFileBuffer = puVar4 + lVar8;
      puVar1 = puVar4 + lVar8;
      lVar8 = lVar8 + 1;
    } while (*puVar1 != '\0');
  }
  puVar1 = this->mFileBuffer;
  paVar2 = &local_178.mName.field_2;
  local_178.mName._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,puVar4);
  std::__cxx11::string::operator=((string *)(pSVar5 + -1),(string *)&local_178);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178.mName._M_dataplus._M_p != paVar2) {
    operator_delete(local_178.mName._M_dataplus._M_p,
                    local_178.mName.field_2._M_allocated_capacity + 1);
  }
  uVar17 = (ulong)((int)puVar1 - (int)puVar4 & 1);
  puVar4 = this->mFileBuffer;
  puVar19 = (uint *)(puVar4 + (2 - uVar17));
  this->mFileBuffer = (uint8_t *)puVar19;
  pbVar9 = puVar4 + (8 - uVar17);
  if (pbVar9 < pbVar7) {
    this_01 = (Texture *)0x0;
    do {
      uVar14 = *puVar19;
      this->mFileBuffer = (uint8_t *)(puVar19 + 1);
      uVar18 = puVar19[1];
      this->mFileBuffer = pbVar9;
      uVar17 = (ulong)(ushort)((ushort)uVar18 << 8 | (ushort)uVar18 >> 8);
      if (pbVar7 < pbVar9 + uVar17) {
        pLVar10 = DefaultLogger::get();
        Logger::error(pLVar10,"LWOB: Invalid surface chunk length. Trying to continue.");
        uVar17 = (long)pbVar7 - (long)this->mFileBuffer;
      }
      uVar18 = uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 | uVar14 << 0x18;
      puVar19 = (uint *)this->mFileBuffer;
      uVar16 = uVar17 & 0xffff;
      uVar14 = (uint)uVar16;
      if ((int)uVar18 < 0x534d414e) {
        if ((int)uVar18 < 0x44544558) {
          if ((int)uVar18 < 0x43544558) {
            list = &pSVar5[-1].mBumpTextures;
            if (uVar18 == 0x42544558) {
LAB_006a64a5:
              this_01 = SetupNewTextureLWOB(this,list,uVar14);
            }
            else if (uVar18 == 0x434f4c52) {
              if (uVar14 < 3) {
                prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
                local_178.mName._M_dataplus._M_p = (pointer)&local_178.mName.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_178,"LWO: COLR chunk is too small","");
                std::runtime_error::runtime_error(prVar12,(string *)&local_178);
                *(undefined ***)prVar12 = &PTR__runtime_error_0082bce0;
                __cxa_throw(prVar12,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error)
                ;
              }
              this->mFileBuffer = (byte *)((long)puVar19 + 1);
              pSVar5[-1].mColor.r = (float)(byte)*puVar19 / 255.0;
              pbVar9 = this->mFileBuffer;
              this->mFileBuffer = pbVar9 + 1;
              pSVar5[-1].mColor.g = (float)*pbVar9 / 255.0;
              pbVar9 = this->mFileBuffer;
              this->mFileBuffer = pbVar9 + 1;
              pSVar5[-1].mColor.b = (float)*pbVar9 / 255.0;
            }
          }
          else {
            list = &pSVar5[-1].mColorTextures;
            if (uVar18 == 0x43544558) goto LAB_006a64a5;
            if (uVar18 == 0x44494646) {
              if (uVar14 < 2) {
                prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
                local_178.mName._M_dataplus._M_p = (pointer)&local_178.mName.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_178,"LWO: DIFF chunk is too small","");
                std::runtime_error::runtime_error(prVar12,(string *)&local_178);
                *(undefined ***)prVar12 = &PTR__runtime_error_0082bce0;
                __cxa_throw(prVar12,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error)
                ;
              }
              uVar14 = *puVar19;
              this->mFileBuffer = (uint8_t *)((long)puVar19 + 2);
              pSVar5[-1].mDiffuseValue =
                   (float)(ushort)((ushort)uVar14 << 8 | (ushort)uVar14 >> 8) / 255.0;
            }
          }
        }
        else if ((int)uVar18 < 0x474c4f53) {
          list = &pSVar5[-1].mDiffuseTextures;
          if (uVar18 == 0x44544558) goto LAB_006a64a5;
          if (uVar18 == 0x464c4147) {
            if (uVar14 < 2) {
              prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
              local_178.mName._M_dataplus._M_p = (pointer)&local_178.mName.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_178,"LWO: FLAG chunk is too small","");
              std::runtime_error::runtime_error(prVar12,(string *)&local_178);
              *(undefined ***)prVar12 = &PTR__runtime_error_0082bce0;
              __cxa_throw(prVar12,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
            }
            uVar14 = *puVar19;
            this->mFileBuffer = (uint8_t *)((long)puVar19 + 2);
            uVar6 = (ushort)uVar14 >> 8;
            if ((uVar6 & 4) != 0) {
              pSVar5[-1].mMaximumSmoothAngle = 1.56207;
            }
            if ((uVar6 & 8) != 0) {
              pSVar5[-1].mColorHighlights = 1.0;
            }
            if (((ushort)uVar14 & 1) != 0) {
              pSVar5[-1].bDoubleSided = true;
            }
          }
        }
        else if (uVar18 == 0x474c4f53) {
          if (uVar14 < 2) {
            prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
            local_178.mName._M_dataplus._M_p = (pointer)&local_178.mName.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_178,"LWO: GLOS chunk is too small","");
            std::runtime_error::runtime_error(prVar12,(string *)&local_178);
            *(undefined ***)prVar12 = &PTR__runtime_error_0082bce0;
            __cxa_throw(prVar12,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
          }
          uVar14 = *puVar19;
          this->mFileBuffer = (uint8_t *)((long)puVar19 + 2);
          pSVar5[-1].mGlossiness = (float)(ushort)((ushort)uVar14 << 8 | (ushort)uVar14 >> 8);
        }
        else if (uVar18 == 0x4c554d49) {
          if (uVar14 < 2) {
            prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
            local_178.mName._M_dataplus._M_p = (pointer)&local_178.mName.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_178,"LWO: LUMI chunk is too small","");
            std::runtime_error::runtime_error(prVar12,(string *)&local_178);
            *(undefined ***)prVar12 = &PTR__runtime_error_0082bce0;
            __cxa_throw(prVar12,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
          }
          uVar14 = *puVar19;
          this->mFileBuffer = (uint8_t *)((long)puVar19 + 2);
          pSVar5[-1].mLuminosity =
               (float)(ushort)((ushort)uVar14 << 8 | (ushort)uVar14 >> 8) / 255.0;
        }
      }
      else if ((int)uVar18 < 0x54494d47) {
        if ((int)uVar18 < 0x53544558) {
          if (uVar18 == 0x534d414e) {
            if (uVar14 < 4) {
              prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
              local_178.mName._M_dataplus._M_p = (pointer)&local_178.mName.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_178,"LWO: SMAN chunk is too small","");
              std::runtime_error::runtime_error(prVar12,(string *)&local_178);
              *(undefined ***)prVar12 = &PTR__runtime_error_0082bce0;
              __cxa_throw(prVar12,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
            }
            uVar14 = *puVar19;
            this->mFileBuffer = (uint8_t *)(puVar19 + 1);
            pSVar5[-1].mMaximumSmoothAngle =
                 (float)(uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 |
                        (uVar14 & 0x7f) << 0x18);
          }
          else if (uVar18 == 0x53504543) {
            if (uVar14 < 2) {
              prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
              local_178.mName._M_dataplus._M_p = (pointer)&local_178.mName.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_178,"LWO: SPEC chunk is too small","");
              std::runtime_error::runtime_error(prVar12,(string *)&local_178);
              *(undefined ***)prVar12 = &PTR__runtime_error_0082bce0;
              __cxa_throw(prVar12,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
            }
            uVar14 = *puVar19;
            this->mFileBuffer = (uint8_t *)((long)puVar19 + 2);
            pSVar5[-1].mSpecularValue =
                 (float)(ushort)((ushort)uVar14 << 8 | (ushort)uVar14 >> 8) / 255.0;
          }
        }
        else {
          list = &pSVar5[-1].mSpecularTextures;
          if (uVar18 == 0x53544558) goto LAB_006a64a5;
          if (uVar18 == 0x54464c47) {
            if (uVar14 < 2) {
              prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
              local_178.mName._M_dataplus._M_p = (pointer)&local_178.mName.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_178,"LWO: TFLG chunk is too small","");
              std::runtime_error::runtime_error(prVar12,(string *)&local_178);
              *(undefined ***)prVar12 = &PTR__runtime_error_0082bce0;
              __cxa_throw(prVar12,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
            }
            if (this_01 == (Texture *)0x0) {
              pLVar10 = DefaultLogger::get();
              message = "LWOB: Unexpected TFLG chunk";
              goto LAB_006a64ed;
            }
            uVar6 = (ushort)*puVar19 >> 8;
            this->mFileBuffer = (uint8_t *)((long)puVar19 + 2);
            AVar13 = AXIS_X;
            if ((((uVar6 & 1) != 0) || (AVar13 = AXIS_Y, (uVar6 & 2) != 0)) ||
               (AVar13 = AXIS_Z, (uVar6 & 4) != 0)) {
              this_01->majorAxis = AVar13;
            }
            if ((uVar6 & 0x10) != 0) {
              pLVar10 = DefaultLogger::get();
              Logger::warn(pLVar10,"LWOB: Ignoring \'negate\' flag on texture");
            }
          }
        }
      }
      else if ((int)uVar18 < 0x54544558) {
        if (uVar18 == 0x54494d47) {
          if (this_01 == (Texture *)0x0) {
            pLVar10 = DefaultLogger::get();
            message = "LWOB: Unexpected TIMG chunk";
LAB_006a64ed:
            Logger::warn(pLVar10,message);
LAB_006a6508:
            this_01 = (Texture *)0x0;
          }
          else {
            bVar3 = (byte)*puVar19;
            puVar11 = puVar19;
            while (bVar3 != 0) {
              puVar11 = (uint *)((long)puVar11 + 1);
              iVar15 = (int)uVar16;
              uVar16 = (ulong)(iVar15 - 1);
              if (iVar15 == 0) {
                pLVar10 = DefaultLogger::get();
                Logger::warn(pLVar10,"LWO: Invalid file, string is is too long");
                break;
              }
              this->mFileBuffer = (uint8_t *)puVar11;
              bVar3 = *(byte *)puVar11;
            }
            puVar4 = this->mFileBuffer;
            paVar2 = &local_178.mName.field_2;
            local_178.mName._M_dataplus._M_p = (pointer)paVar2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,puVar19,puVar4);
            std::__cxx11::string::operator=((string *)this_01,(string *)&local_178);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_178.mName._M_dataplus._M_p != paVar2) {
              operator_delete(local_178.mName._M_dataplus._M_p,
                              local_178.mName.field_2._M_allocated_capacity + 1);
            }
            this->mFileBuffer = this->mFileBuffer + (2 - (ulong)((int)puVar4 - (int)puVar19 & 1));
          }
        }
        else if (uVar18 == 0x5452414e) {
          if (uVar14 < 2) {
            prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
            local_178.mName._M_dataplus._M_p = (pointer)&local_178.mName.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_178,"LWO: TRAN chunk is too small","");
            std::runtime_error::runtime_error(prVar12,(string *)&local_178);
            *(undefined ***)prVar12 = &PTR__runtime_error_0082bce0;
            __cxa_throw(prVar12,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
          }
          uVar14 = *puVar19;
          this->mFileBuffer = (uint8_t *)((long)puVar19 + 2);
          pSVar5[-1].mTransparency =
               (float)(ushort)((ushort)uVar14 << 8 | (ushort)uVar14 >> 8) / 255.0;
        }
      }
      else {
        list = &pSVar5[-1].mOpacityTextures;
        if (uVar18 == 0x54544558) goto LAB_006a64a5;
        if (uVar18 == 0x5456414c) {
          if (uVar14 == 0) {
            prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
            local_178.mName._M_dataplus._M_p = (pointer)&local_178.mName.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_178,"LWO: TVAL chunk is too small","");
            std::runtime_error::runtime_error(prVar12,(string *)&local_178);
            *(undefined ***)prVar12 = &PTR__runtime_error_0082bce0;
            __cxa_throw(prVar12,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
          }
          if (this_01 == (Texture *)0x0) {
            pLVar10 = DefaultLogger::get();
            Logger::error(pLVar10,"LWOB: Unexpected TVAL chunk");
            goto LAB_006a6508;
          }
          this->mFileBuffer = (byte *)((long)puVar19 + 1);
          this_01->mStrength = (float)(byte)*puVar19 / 255.0;
        }
      }
      puVar19 = (uint *)((long)puVar19 + (uVar17 & 0xffff));
      this->mFileBuffer = (uint8_t *)puVar19;
      pbVar9 = (byte *)((long)puVar19 + 6);
    } while (pbVar9 < pbVar7);
  }
  return;
}

Assistant:

void LWOImporter::LoadLWOBSurface(unsigned int size)
{
    LE_NCONST uint8_t* const end = mFileBuffer + size;

    mSurfaces->push_back( LWO::Surface () );
    LWO::Surface& surf = mSurfaces->back();
    LWO::Texture* pTex = NULL;

    GetS0(surf.mName,size);
    bool running = true;
    while (running)    {
        if (mFileBuffer + 6 >= end)
            break;

        IFF::SubChunkHeader head = IFF::LoadSubChunk(mFileBuffer);

        /*  A single test file (sonycam.lwo) seems to have invalid surface chunks.
         *  I'm assuming it's the fault of a single, unknown exporter so there are
         *  probably THOUSANDS of them. Here's a dirty workaround:
         *
         *  We don't break if the chunk limit is exceeded. Instead, we're computing
         *  how much storage is actually left and work with this value from now on.
         */
        if (mFileBuffer + head.length > end) {
            ASSIMP_LOG_ERROR("LWOB: Invalid surface chunk length. Trying to continue.");
            head.length = (uint16_t) (end - mFileBuffer);
        }

        uint8_t* const next = mFileBuffer+head.length;
        switch (head.type)
        {
        // diffuse color
        case AI_LWO_COLR:
            {
                AI_LWO_VALIDATE_CHUNK_LENGTH(head.length,COLR,3);
                surf.mColor.r = GetU1() / 255.0f;
                surf.mColor.g = GetU1() / 255.0f;
                surf.mColor.b = GetU1() / 255.0f;
                break;
            }
        // diffuse strength ...
        case AI_LWO_DIFF:
            {
                AI_LWO_VALIDATE_CHUNK_LENGTH(head.length,DIFF,2);
                surf.mDiffuseValue = GetU2() / 255.0f;
                break;
            }
        // specular strength ...
        case AI_LWO_SPEC:
            {
                AI_LWO_VALIDATE_CHUNK_LENGTH(head.length,SPEC,2);
                surf.mSpecularValue = GetU2() / 255.0f;
                break;
            }
        // luminosity ...
        case AI_LWO_LUMI:
            {
                AI_LWO_VALIDATE_CHUNK_LENGTH(head.length,LUMI,2);
                surf.mLuminosity = GetU2() / 255.0f;
                break;
            }
        // transparency
        case AI_LWO_TRAN:
            {
                AI_LWO_VALIDATE_CHUNK_LENGTH(head.length,TRAN,2);
                surf.mTransparency = GetU2() / 255.0f;
                break;
            }
        // surface flags
        case AI_LWO_FLAG:
            {
                AI_LWO_VALIDATE_CHUNK_LENGTH(head.length,FLAG,2);
                uint16_t flag = GetU2();
                if (flag & 0x4 )   surf.mMaximumSmoothAngle = 1.56207f;
                if (flag & 0x8 )   surf.mColorHighlights = 1.f;
                if (flag & 0x100)  surf.bDoubleSided = true;
                break;
            }
        // maximum smoothing angle
        case AI_LWO_SMAN:
            {
                AI_LWO_VALIDATE_CHUNK_LENGTH(head.length,SMAN,4);
                surf.mMaximumSmoothAngle = std::fabs( GetF4() );
                break;
            }
        // glossiness
        case AI_LWO_GLOS:
            {
                AI_LWO_VALIDATE_CHUNK_LENGTH(head.length,GLOS,2);
                surf.mGlossiness = (float)GetU2();
                break;
            }
        // color texture
        case AI_LWO_CTEX:
            {
                pTex = SetupNewTextureLWOB(surf.mColorTextures,
                    head.length);
                break;
            }
        // diffuse texture
        case AI_LWO_DTEX:
            {
                pTex = SetupNewTextureLWOB(surf.mDiffuseTextures,
                    head.length);
                break;
            }
        // specular texture
        case AI_LWO_STEX:
            {
                pTex = SetupNewTextureLWOB(surf.mSpecularTextures,
                    head.length);
                break;
            }
        // bump texture
        case AI_LWO_BTEX:
            {
                pTex = SetupNewTextureLWOB(surf.mBumpTextures,
                    head.length);
                break;
            }
        // transparency texture
        case AI_LWO_TTEX:
            {
                pTex = SetupNewTextureLWOB(surf.mOpacityTextures,
                    head.length);
                break;
            }
        // texture path
        case AI_LWO_TIMG:
            {
                if (pTex)   {
                    GetS0(pTex->mFileName,head.length);
                } else {
                    ASSIMP_LOG_WARN("LWOB: Unexpected TIMG chunk");
                }
                break;
            }
        // texture strength
        case AI_LWO_TVAL:
            {
                AI_LWO_VALIDATE_CHUNK_LENGTH(head.length,TVAL,1);
                if (pTex)   {
                    pTex->mStrength = (float)GetU1()/ 255.f;
                } else {
                    ASSIMP_LOG_ERROR("LWOB: Unexpected TVAL chunk");
                }
                break;
            }
        // texture flags
        case AI_LWO_TFLG:
            {
                AI_LWO_VALIDATE_CHUNK_LENGTH(head.length,TFLG,2);

                if (nullptr != pTex) {
                    const uint16_t s = GetU2();
                    if (s & 1)
                        pTex->majorAxis = LWO::Texture::AXIS_X;
                    else if (s & 2)
                        pTex->majorAxis = LWO::Texture::AXIS_Y;
                    else if (s & 4)
                        pTex->majorAxis = LWO::Texture::AXIS_Z;

                    if (s & 16) {
                        ASSIMP_LOG_WARN("LWOB: Ignoring \'negate\' flag on texture");
                    }
                }
                else {
                    ASSIMP_LOG_WARN("LWOB: Unexpected TFLG chunk");
                }
                break;
            }
        }
        mFileBuffer = next;
    }
}